

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O2

int unhexify(uchar *output,char *input,size_t *olen)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  
  sVar3 = strlen(input);
  *olen = sVar3;
  iVar2 = -1;
  if (sVar3 < 0x41 && (sVar3 & 1) == 0) {
    uVar4 = sVar3 >> 1;
    *olen = uVar4;
    for (uVar5 = 0; uVar5 < uVar4 * 2; uVar5 = uVar5 + 2) {
      cVar1 = input[uVar5];
      bVar6 = cVar1 - 0x30;
      if (9 < bVar6) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar6 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            return -1;
          }
          bVar6 = cVar1 - 0x37;
        }
      }
      *output = bVar6 << 4;
      cVar1 = input[uVar5 + 1];
      bVar7 = cVar1 - 0x30;
      if (9 < bVar7) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar7 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            return -1;
          }
          bVar7 = cVar1 - 0x37;
        }
      }
      *output = bVar7 | bVar6 << 4;
      uVar4 = *olen;
      output = output + 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int unhexify( unsigned char *output, const char *input, size_t *olen )
{
    unsigned char c;
    size_t j;

    *olen = strlen( input );
    if( *olen % 2 != 0 || *olen / 2 > MBEDTLS_PSK_MAX_LEN )
        return( -1 );
    *olen /= 2;

    for( j = 0; j < *olen * 2; j += 2 )
    {
        c = input[j];
        HEX2NUM( c );
        output[ j / 2 ] = c << 4;

        c = input[j + 1];
        HEX2NUM( c );
        output[ j / 2 ] |= c;
    }

    return( 0 );
}